

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

uint32_t * light_pcapng_to_memory(light_pcapng pcapng,size_t *size)

{
  uint uVar1;
  size_t __n;
  uint uVar2;
  size_t __nmemb;
  uint32_t *puVar3;
  uint32_t *__src;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint32_t *puVar7;
  size_t option_length;
  
  if (pcapng == (light_pcapng)0x0) {
    *size = 0;
    puVar3 = (uint32_t *)0x0;
  }
  else {
    __nmemb = light_get_size(pcapng);
    puVar3 = (uint32_t *)calloc(__nmemb,1);
    if (puVar3 == (uint32_t *)0x0) {
      puVar3 = (uint32_t *)0x0;
      fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"light_pcapng_to_memory",0x15a);
    }
    else {
      *size = 0;
      puVar7 = puVar3;
      for (; (pcapng != (light_pcapng)0x0 && (__nmemb != 0)); __nmemb = __nmemb - uVar6) {
        lVar5 = (ulong)pcapng->block_total_lenght - 0xc;
        __src = __get_option_size(pcapng->options,&option_length);
        __n = option_length;
        uVar6 = lVar5 - option_length;
        *puVar7 = pcapng->block_type;
        puVar7[1] = pcapng->block_total_lenght;
        memcpy(puVar7 + 2,pcapng->block_body,uVar6);
        memcpy((void *)((long)puVar7 + (uVar6 & 0xfffffffffffffffc) + 8),__src,__n);
        uVar1 = pcapng->block_total_lenght;
        uVar6 = (ulong)uVar1;
        uVar2 = uVar1 >> 2;
        puVar7[uVar2 - 1] = uVar1;
        uVar4 = (int)lVar5 + 0xc;
        if (uVar1 != uVar4) {
          fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"light_pcapng_to_memory",0x169,uVar6,uVar4);
          uVar6 = (ulong)pcapng->block_total_lenght;
          uVar2 = pcapng->block_total_lenght >> 2;
        }
        puVar7 = puVar7 + uVar2;
        *size = *size + uVar6;
        free(__src);
        pcapng = pcapng->next_block;
      }
    }
  }
  return puVar3;
}

Assistant:

uint32_t *light_pcapng_to_memory(const light_pcapng pcapng, size_t *size)
{
	if (pcapng == NULL) {
		*size = 0;
		return NULL;
	}

	light_pcapng iterator = pcapng;
	size_t bytes = light_get_size(pcapng);
	uint32_t *block_mem = calloc(bytes, 1);
	uint32_t *block_offset = block_mem;
	DCHECK_NULLP(block_offset, return NULL);

	*size = 0;
	while (iterator != NULL && bytes > 0) {
		size_t body_length = iterator->block_total_lenght - 2 * sizeof(iterator->block_total_lenght) - sizeof(iterator->block_type);
		size_t option_length;
		uint32_t *option_mem = __get_option_size(iterator->options, &option_length);
		body_length -= option_length;

		block_offset[0] = iterator->block_type;
		block_offset[1] = iterator->block_total_lenght;
		memcpy(&block_offset[2], iterator->block_body, body_length);
		memcpy(&block_offset[2 + body_length / 4], option_mem, option_length);
		block_offset[iterator->block_total_lenght / 4 - 1] = iterator->block_total_lenght;

		DCHECK_ASSERT(iterator->block_total_lenght, body_length + option_length + 3 * sizeof(uint32_t), light_stop);
		block_offset += iterator->block_total_lenght / 4;
		bytes -= iterator->block_total_lenght;
		*size += iterator->block_total_lenght;

		free(option_mem);
		iterator = iterator->next_block;
	}

	return block_mem;
}